

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O0

void anon_unknown.dwarf_1459a9::testFile2(char *fileName,bool exists,bool exrFile,bool tiledFile)

{
  byte bVar1;
  ostream *poVar2;
  long lVar3;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  char *pcVar4;
  char *in_RDI;
  StdIFStream is;
  bool tiled;
  bool exr;
  StdIFStream local_48 [59];
  bool local_d;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  char *local_8;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_b = in_CL & 1;
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,in_RDI);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  local_c = Imf_3_2::isOpenExrFile(local_8,&local_d);
  local_c = local_c & 1;
  if (local_c != (local_a & 1) || (local_d & 1U) != (local_b & 1)) {
    __assert_fail("exr == exrFile && tiled == tiledFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x37,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  local_c = Imf_3_2::isOpenExrFile(local_8);
  local_c = local_c & 1;
  if (local_c != (local_a & 1)) {
    __assert_fail("exr == exrFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x3a,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  bVar1 = Imf_3_2::isTiledOpenExrFile(local_8);
  local_d = (bool)(bVar1 & 1);
  if (local_d != (bool)(local_b & 1)) {
    __assert_fail("tiled == tiledFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x3d,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  if ((local_9 & 1) != 0) {
    Imf_3_2::StdIFStream::StdIFStream(local_48,local_8);
    local_c = Imf_3_2::isOpenExrFile((IStream *)local_48,&local_d);
    local_c = local_c & 1;
    if (local_c != (local_a & 1) || (local_d & 1U) != (local_b & 1)) {
      __assert_fail("exr == exrFile && tiled == tiledFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                    ,0x44,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
    }
    if ((local_c != 0) && (lVar3 = Imf_3_2::StdIFStream::tellg(), lVar3 != 0)) {
      __assert_fail("is.tellg () == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                    ,0x46,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
    }
    local_c = Imf_3_2::isOpenExrFile((IStream *)local_48);
    local_c = local_c & 1;
    if (local_c != (local_a & 1)) {
      __assert_fail("exr == exrFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                    ,0x49,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
    }
    if ((local_c != 0) && (lVar3 = Imf_3_2::StdIFStream::tellg(), lVar3 != 0)) {
      __assert_fail("is.tellg () == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                    ,0x4b,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
    }
    bVar1 = Imf_3_2::isTiledOpenExrFile((IStream *)local_48);
    local_d = (bool)(bVar1 & 1);
    if (local_d != (bool)(local_b & 1)) {
      __assert_fail("tiled == tiledFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                    ,0x4e,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
    }
    if ((local_d != false) && (lVar3 = Imf_3_2::StdIFStream::tellg(), lVar3 != 0)) {
      __assert_fail("is.tellg () == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                    ,0x50,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
    }
    Imf_3_2::StdIFStream::~StdIFStream(local_48);
  }
  pcVar4 = "does not exist";
  if ((local_9 & 1) != 0) {
    pcVar4 = "exists";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar2 = std::operator<<(poVar2,", ");
  pcVar4 = "is not an OpenEXR file";
  if ((local_a & 1) != 0) {
    pcVar4 = "is an OpenEXR file";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,", ");
  pcVar4 = "is not tiled";
  if ((local_b & 1) != 0) {
    pcVar4 = "is tiled";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testFile2 (const char fileName[], bool exists, bool exrFile, bool tiledFile)
{
    cout << fileName << " " << flush;

    bool exr, tiled;

    exr = isOpenExrFile (fileName, tiled);
    assert (exr == exrFile && tiled == tiledFile);

    exr = isOpenExrFile (fileName);
    assert (exr == exrFile);

    tiled = isTiledOpenExrFile (fileName);
    assert (tiled == tiledFile);

    if (exists)
    {
        StdIFStream is (fileName);

        exr = isOpenExrFile (is, tiled);
        assert (exr == exrFile && tiled == tiledFile);

        if (exr) assert (is.tellg () == 0);

        exr = isOpenExrFile (is);
        assert (exr == exrFile);

        if (exr) assert (is.tellg () == 0);

        tiled = isTiledOpenExrFile (is);
        assert (tiled == tiledFile);

        if (tiled) assert (is.tellg () == 0);
    }

    cout << (exists ? "exists" : "does not exist") << ", "
         << (exrFile ? "is an OpenEXR file" : "is not an OpenEXR file") << ", "
         << (tiledFile ? "is tiled" : "is not tiled") << endl;
}